

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Aig_Man_t * Abc_NtkToDarBmc(Abc_Ntk_t *pNtk,Vec_Int_t **pvMap)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  ulong uVar2;
  int iVar3;
  Abc_Ntk_t *pLatch;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Vec_Int_t *pVVar4;
  Abc_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Man_t *p_01;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *p1;
  uint uVar9;
  Abc_Ntk_t *pAVar10;
  Aig_Man_t *pAVar11;
  int i;
  int iVar12;
  
  uVar9 = 0;
  pAVar10 = pNtk;
  for (iVar12 = 0; iVar3 = (int)pAVar10, iVar12 < pNtk->vBoxes->nSize; iVar12 = iVar12 + 1) {
    pAVar10 = pNtk;
    pLatch = (Abc_Ntk_t *)Abc_NtkBox(pNtk,iVar12);
    if (((ulong)pLatch->pSpec & 0xf00000000) == 0x800000000) {
      pAVar10 = pLatch;
      iVar3 = Abc_LatchIsInitDc((Abc_Obj_t *)pLatch);
      if (iVar3 != 0) {
        Abc_LatchSetInit0((Abc_Obj_t *)pLatch);
        uVar9 = uVar9 + 1;
        pAVar10 = pLatch;
      }
    }
  }
  if (uVar9 != 0) {
    Abc_Print(iVar3,"Warning: %d registers in this network have don\'t-care init values.\n",
              (ulong)uVar9);
    Abc_Print(iVar3,"The don\'t-care are assumed to be 0. The result may not verify.\n");
    Abc_Print(iVar3,"Use command \"print_latch\" to see the init values of registers.\n");
    Abc_Print(iVar3,"Use command \"zero\" to convert or \"init\" to change the values.\n");
  }
  p = Vec_PtrAlloc(100);
  p_00 = Vec_PtrAlloc(100);
  if (pvMap != (Vec_Int_t **)0x0) {
    pVVar4 = Vec_IntAlloc(100);
    *pvMap = pVVar4;
  }
  for (iVar12 = 0; iVar12 < pNtk->vPos->nSize; iVar12 = iVar12 + 1) {
    pAVar5 = Abc_NtkPo(pNtk,iVar12);
    iVar3 = pNtk->nConstrs;
    pAVar5 = Abc_ObjChild0(pAVar5);
    if (iVar12 < iVar3 || iVar3 == 0) {
      Abc_CollectTopOr(pAVar5,p);
      i = 0;
      iVar3 = p->nSize;
      if (p->nSize < 1) {
        iVar3 = i;
      }
      for (; iVar3 != i; i = i + 1) {
        pvVar6 = Vec_PtrEntry(p,i);
        Vec_PtrPush(p_00,pvVar6);
        if (pvMap != (Vec_Int_t **)0x0) {
          Vec_IntPush(*pvMap,iVar12);
        }
      }
    }
    else {
      Vec_PtrPush(p_00,(void *)((ulong)pAVar5 ^ 1));
      if (pvMap != (Vec_Int_t **)0x0) {
        Vec_IntPush(*pvMap,iVar12);
      }
    }
  }
  Vec_PtrFree(p);
  p_01 = Aig_ManStart(pNtk->nObjCounts[7] + 100);
  iVar12 = pNtk->nBarBufs;
  p_01->nConstrs = pNtk->nConstrs;
  p_01->nBarBufs = iVar12;
  pcVar7 = Extra_UtilStrsav(pNtk->pName);
  p_01->pName = pcVar7;
  pcVar7 = Extra_UtilStrsav(pNtk->pSpec);
  p_01->pSpec = pcVar7;
  aVar1 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p_01->pConst1;
  pAVar5 = Abc_AigConst1(pNtk);
  pAVar5->field_6 = aVar1;
  for (iVar12 = 0; iVar12 < pNtk->vCis->nSize; iVar12 = iVar12 + 1) {
    pAVar5 = Abc_NtkCi(pNtk,iVar12);
    pAVar8 = (Abc_Obj_t *)Aig_ObjCreateCi(p_01);
    (pAVar5->field_6).pCopy = pAVar8;
  }
  for (iVar12 = 0; iVar12 < pNtk->vBoxes->nSize; iVar12 = iVar12 + 1) {
    pAVar5 = Abc_NtkBox(pNtk,iVar12);
    if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
      uVar2 = *(ulong *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray] + 0x40);
      uVar9 = Abc_LatchIsInit1(pAVar5);
      *(ulong *)((long)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray] + 0x40) =
           uVar9 ^ uVar2;
    }
  }
  for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,iVar12);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar5->field_0x14 & 0xf) == 7)) {
      pAVar8 = Abc_ObjChild0Copy(pAVar5);
      p1 = Abc_ObjChild1Copy(pAVar5);
      pAVar8 = (Abc_Obj_t *)Aig_And(p_01,(Aig_Obj_t *)pAVar8,(Aig_Obj_t *)p1);
      (pAVar5->field_6).pCopy = pAVar8;
    }
  }
  iVar3 = 0;
  iVar12 = p_00->nSize;
  if (p_00->nSize < 1) {
    iVar12 = iVar3;
  }
  for (; iVar12 != iVar3; iVar3 = iVar3 + 1) {
    pvVar6 = Vec_PtrEntry(p_00,iVar3);
    Aig_ObjCreateCo(p_01,(Aig_Obj_t *)
                         ((ulong)((uint)pvVar6 & 1) ^
                          *(ulong *)(((ulong)pvVar6 & 0xfffffffffffffffe) + 0x40) ^ 1));
  }
  Vec_PtrFree(p_00);
  for (iVar12 = 0; iVar12 < pNtk->vBoxes->nSize; iVar12 = iVar12 + 1) {
    pAVar5 = Abc_NtkBox(pNtk,iVar12);
    if ((*(uint *)&pAVar5->field_0x14 & 0xf) == 8) {
      pAVar5 = Abc_NtkBox(pNtk,iVar12);
      pAVar5 = (Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray];
      pAVar8 = Abc_ObjChild0Copy(pAVar5);
      uVar9 = Abc_LatchIsInit1((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray])
      ;
      Aig_ObjCreateCo(p_01,(Aig_Obj_t *)((ulong)uVar9 ^ (ulong)pAVar8));
    }
  }
  Aig_ManSetRegNum(p_01,pNtk->nObjCounts[8]);
  Aig_ManCleanup(p_01);
  pAVar11 = p_01;
  iVar12 = Aig_ManCheck(p_01);
  if (iVar12 == 0) {
    Abc_Print((int)pAVar11,"Abc_NtkToDarBmc: AIG check has failed.\n");
    Aig_ManStop(p_01);
    p_01 = (Aig_Man_t *)0x0;
  }
  return p_01;
}

Assistant:

Aig_Man_t * Abc_NtkToDarBmc( Abc_Ntk_t * pNtk, Vec_Int_t ** pvMap )
{
    Aig_Man_t * pMan;
    Abc_Obj_t * pObj, * pTemp;
    Vec_Ptr_t * vDrivers;
    Vec_Ptr_t * vSuper;
    int i, k, nDontCares;

    // print warning about initial values
    nDontCares = 0;
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( Abc_LatchIsInitDc(pObj) )
        {
            Abc_LatchSetInit0(pObj);
            nDontCares++;
        }
    if ( nDontCares )
    {
        Abc_Print( 1, "Warning: %d registers in this network have don't-care init values.\n", nDontCares );
        Abc_Print( 1, "The don't-care are assumed to be 0. The result may not verify.\n" );
        Abc_Print( 1, "Use command \"print_latch\" to see the init values of registers.\n" );
        Abc_Print( 1, "Use command \"zero\" to convert or \"init\" to change the values.\n" );
    }

    // collect the drivers
    vSuper   = Vec_PtrAlloc( 100 );
    vDrivers = Vec_PtrAlloc( 100 );
    if ( pvMap ) 
    *pvMap   = Vec_IntAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( pNtk->nConstrs && i >= pNtk->nConstrs )
        {
            Vec_PtrPush( vDrivers, Abc_ObjNot(Abc_ObjChild0(pObj)) );
            if ( pvMap )
            Vec_IntPush( *pvMap, i );
            continue;
        }
        Abc_CollectTopOr( Abc_ObjChild0(pObj), vSuper );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pTemp, k )
        {
            Vec_PtrPush( vDrivers, pTemp );
            if ( pvMap )
            Vec_IntPush( *pvMap, i );
        }       
    }
    Vec_PtrFree( vSuper );

    // create network
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
    // create flops
    Abc_NtkForEachLatch( pNtk, pObj, i )
        Abc_ObjFanout0(pObj)->pCopy = Abc_ObjNotCond( Abc_ObjFanout0(pObj)->pCopy, Abc_LatchIsInit1(pObj) );
    // copy internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
    // create the POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vDrivers, pTemp, k )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjNotCond(Abc_ObjRegular(pTemp)->pCopy, !Abc_ObjIsComplement(pTemp)) );
    Vec_PtrFree( vDrivers );
    // create flops
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjNotCond(Abc_ObjChild0Copy(pObj), Abc_LatchIsInit1(Abc_ObjFanout0(pObj))) );

    // remove dangling nodes
    Aig_ManSetRegNum( pMan, Abc_NtkLatchNum(pNtk) );
    Aig_ManCleanup( pMan );
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDarBmc: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}